

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

QMap<int,_QVariant> __thiscall QListModel::itemData(QListModel *this,QModelIndex *index)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  QModelIndex *in_RDX;
  int i;
  ulong uVar4;
  long lVar5;
  
  *(undefined8 *)this = 0;
  bVar3 = QModelIndex::isValid(in_RDX);
  if ((bVar3) && ((long)in_RDX->r < (long)index[1].i)) {
    lVar1 = *(long *)(*(long *)(index + 1) + (long)in_RDX->r * 8);
    lVar5 = 8;
    for (uVar4 = 0; lVar2 = *(long *)(lVar1 + 0x18), uVar4 < *(ulong *)(lVar2 + 0x18);
        uVar4 = uVar4 + 1) {
      lVar2 = *(long *)(lVar2 + 0x10);
      QMap<int,_QVariant>::insert
                ((QMap<int,_QVariant> *)this,(int *)(lVar2 + lVar5 + -8),(QVariant *)(lVar2 + lVar5)
                );
      lVar5 = lVar5 + 0x28;
    }
  }
  return (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          )(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
            )this;
}

Assistant:

QMap<int, QVariant> QListModel::itemData(const QModelIndex &index) const
{
    QMap<int, QVariant> roles;
    if (!index.isValid() || index.row() >= items.size())
        return roles;
    QListWidgetItem *itm = items.at(index.row());
    for (int i = 0; i < itm->d->values.size(); ++i) {
        roles.insert(itm->d->values.at(i).role,
                     itm->d->values.at(i).value);
    }
    return roles;
}